

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpproxy.cpp
# Opt level: O0

int __thiscall tcpproxy::do_accept(tcpproxy *this,int connectfd)

{
  naiveconfig *pnVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int *piVar4;
  mapped_type *pmVar5;
  undefined1 local_30 [8];
  sockaddr_in dest_addr;
  int dest_fd;
  int connectfd_local;
  tcpproxy *this_local;
  
  dest_addr.sin_zero[0] = '\0';
  dest_addr.sin_zero[1] = '\0';
  dest_addr.sin_zero[2] = '\0';
  dest_addr.sin_zero[3] = '\0';
  dest_addr.sin_zero._4_4_ = connectfd;
  dest_addr.sin_zero._0_4_ = socket(2,1,6);
  bzero(local_30,0x10);
  local_30._0_2_ = 2;
  local_30._2_2_ = htons(((this->super_proxy).cfg)->dest_port);
  local_30._4_4_ = ((this->super_proxy).cfg)->dest_ipaddr;
  (*(this->super_proxy)._vptr_proxy[7])(this,(ulong)(uint)dest_addr.sin_zero._0_4_);
  (*(this->super_proxy)._vptr_proxy[7])(this,(ulong)(uint)dest_addr.sin_zero._4_4_);
  connect(dest_addr.sin_zero._0_4_,(sockaddr *)local_30,0x10);
  piVar4 = __errno_location();
  uVar2 = dest_addr.sin_zero._0_4_;
  if (*piVar4 == 0x73) {
    pmVar5 = std::
             unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
             ::operator[](&this->sfh,(key_type *)(dest_addr.sin_zero + 4));
    uVar3 = dest_addr.sin_zero._4_4_;
    *pmVar5 = uVar2;
    pmVar5 = std::
             unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
             ::operator[](&this->sfh,(key_type *)dest_addr.sin_zero);
    *pmVar5 = uVar3;
    pnVar1 = (this->super_proxy).cfg;
    pnVar1->client_num = pnVar1->client_num + 1;
    epoll_addfd(this,dest_addr.sin_zero._4_4_);
    epoll_addfd(this,dest_addr.sin_zero._0_4_);
    this_local._4_1_ = dest_addr.sin_zero[0];
    this_local._5_1_ = dest_addr.sin_zero[1];
    this_local._6_1_ = dest_addr.sin_zero[2];
    this_local._7_1_ = dest_addr.sin_zero[3];
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int tcpproxy::do_accept(int connectfd)
{

    int dest_fd = 0;
    dest_fd = socket(AF_INET, SOCK_STREAM, IPPROTO_TCP);

    struct sockaddr_in dest_addr;
    bzero(&dest_addr, sizeof(dest_addr));
    dest_addr.sin_family = AF_INET;
    dest_addr.sin_port = htons(cfg->dest_port);
    dest_addr.sin_addr.s_addr = cfg->dest_ipaddr;

    setnonblocking(dest_fd);
    setnonblocking(connectfd);
    connect(dest_fd, (struct sockaddr *)&dest_addr, sizeof(dest_addr));
    if (errno != EINPROGRESS)
    {
        //perror("connect");
        return -1;
    }

    sfh[connectfd] = dest_fd;
    sfh[dest_fd] = connectfd;

    //连接计数+1
    cfg->client_num++;

    //将两个socket添加到epoll事件中
    epoll_addfd(connectfd);
    epoll_addfd(dest_fd);

    return dest_fd;
}